

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O1

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>
          (cow_guarded<int,_std::timed_mutex> *this,int *data)

{
  shared_ptr<int> local_28;
  
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count = 1
  ;
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
       1;
  (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00174bd0;
  local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  *(int *)&local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
           _vptr__Sp_counted_base = *data;
  lr_guarded<std::shared_ptr<int_const>,std::mutex>::lr_guarded<std::shared_ptr<int>>
            (&this->m_data,&local_28);
  if (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

cow_guarded<T, M>::cow_guarded(Us&&... data):
    m_data(std::make_shared<T>(std::forward<Us>(data)...))
{
}